

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

void close_openssl_instance(TLS_IO_INSTANCE *tls_io_instance)

{
  TLS_IO_INSTANCE *tls_io_instance_local;
  
  if (tls_io_instance->ssl != (SSL *)0x0) {
    SSL_free((SSL *)tls_io_instance->ssl);
    tls_io_instance->ssl = (SSL *)0x0;
  }
  if (tls_io_instance->ssl_context != (SSL_CTX *)0x0) {
    SSL_CTX_free((SSL_CTX *)tls_io_instance->ssl_context);
    tls_io_instance->ssl_context = (SSL_CTX *)0x0;
  }
  return;
}

Assistant:

static void close_openssl_instance(TLS_IO_INSTANCE* tls_io_instance)
{
    if (tls_io_instance->ssl != NULL)
    {
        SSL_free(tls_io_instance->ssl);
        tls_io_instance->ssl = NULL;
    }
    if (tls_io_instance->ssl_context != NULL)
    {
        SSL_CTX_free(tls_io_instance->ssl_context);
        tls_io_instance->ssl_context = NULL;
    }
}